

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

void __thiscall
QGraphicsItemAnimationPrivate::insertUniquePair
          (QGraphicsItemAnimationPrivate *this,qreal step,qreal value,
          QList<QGraphicsItemAnimationPrivate::Pair> *binList,char *method)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  Pair local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = check_step_valid(step,method);
  if (bVar1) {
    local_30.step = step;
    local_30.value = value;
    iVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::begin(binList);
    iVar3 = QList<QGraphicsItemAnimationPrivate::Pair>::end(binList);
    iVar2 = std::
            __lower_bound<QList<QGraphicsItemAnimationPrivate::Pair>::iterator,QGraphicsItemAnimationPrivate::Pair,__gnu_cxx::__ops::_Iter_less_val>
                      (iVar2.i,iVar3.i,&local_30);
    iVar3 = QList<QGraphicsItemAnimationPrivate::Pair>::end(binList);
    if ((iVar2.i == iVar3.i) || (local_30.step < (iVar2.i)->step)) {
      QList<QGraphicsItemAnimationPrivate::Pair>::insert(binList,(const_iterator)iVar2.i,&local_30);
    }
    else {
      (iVar2.i)->value = value;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemAnimationPrivate::insertUniquePair(qreal step, qreal value, QList<Pair> *binList,
                                                     const char *method)
{
    if (!check_step_valid(step, method))
        return;

    const Pair pair = { step, value };

    const QList<Pair>::iterator result = std::lower_bound(binList->begin(), binList->end(), pair);
    if (result == binList->end() || pair < *result)
        binList->insert(result, pair);
    else
        result->value = value;
}